

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall
xray_re::cse_alife_object::state_read(cse_alife_object *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  size_t size_00;
  undefined1 *dest;
  char value;
  unsigned_short value_3;
  float value_1;
  int value_2;
  uint value_4;
  undefined1 local_27;
  undefined1 local_26 [2];
  undefined1 local_24 [4];
  undefined1 local_20 [4];
  byte local_1c [4];
  
  uVar1 = (this->super_cse_abstract).m_version;
  if (uVar1 == 0) goto LAB_00150b38;
  if (uVar1 < 0x19) {
    dest = &local_27;
    size_00 = 1;
LAB_00150ad4:
    xr_packet::r_raw(packet,dest,size_00);
  }
  else if (uVar1 < 0x53) {
    dest = local_24;
    size_00 = 4;
    goto LAB_00150ad4;
  }
  if ((this->super_cse_abstract).m_version < 0x53) {
    xr_packet::r_raw(packet,local_20,4);
  }
  if ((this->super_cse_abstract).m_version < 4) {
    xr_packet::r_raw(packet,local_26,2);
  }
  xr_packet::r_raw(packet,&this->m_graph_id,2);
  xr_packet::r_raw(packet,&this->m_distance,4);
LAB_00150b38:
  if (3 < (this->super_cse_abstract).m_version) {
    xr_packet::r_raw(packet,local_1c,4);
    this->m_direct_control = (bool)(local_1c[0] & 1);
  }
  if (7 < (this->super_cse_abstract).m_version) {
    xr_packet::r_raw(packet,&this->m_node_id,4);
  }
  uVar2 = (this->super_cse_abstract).m_version;
  if ((ushort)(uVar2 - 0x17) < 0x39) {
    xr_packet::r_raw(packet,&(this->super_cse_abstract).m_spawn_id,2);
  }
  uVar3 = (this->super_cse_abstract).m_version;
  if ((ushort)(uVar3 - 0x18) < 0x3c) {
    xr_packet::skip_sz(packet);
  }
  if (0x31 < (this->super_cse_abstract).m_version) {
    xr_packet::r_raw(packet,&this->m_flags,4);
  }
  if (0x39 < (this->super_cse_abstract).m_version) {
    xr_packet::r_sz(packet,&(this->super_cse_abstract).m_ini_string);
  }
  if (0x3d < (this->super_cse_abstract).m_version) {
    xr_packet::r_raw(packet,&this->m_story_id,4);
  }
  if (0x6f < (this->super_cse_abstract).m_version) {
    xr_packet::r_raw(packet,&this->m_spawn_story_id,4);
  }
  return;
}

Assistant:

void cse_alife_object::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version >= CSE_VERSION_0x01) {
		if (m_version <= CSE_VERSION_0x18)
			packet.r_s8();
		else if (m_version < CSE_VERSION_0x53)
			packet.r_float();
		if (m_version < CSE_VERSION_0x53)
			packet.r_s32();
		if (m_version < CSE_VERSION_0x04)
			packet.r_u16();
		packet.r_u16(m_graph_id);
		packet.r_float(m_distance);
	}
	if (m_version >= CSE_VERSION_0x04)
		m_direct_control = (packet.r_u32() & 1) != 0;
	if (m_version >= CSE_VERSION_0x08)
		packet.r_u32(m_node_id);
	if (m_version > CSE_VERSION_0x16 && m_version <= CSE_VERSION_0x4f)
		packet.r_u16(m_spawn_id);
	if (m_version > CSE_VERSION_0x17 && m_version < CSE_VERSION_0x54)
		packet.skip_sz();
	if (m_version > CSE_VERSION_0x31)
		packet.r_u32(m_flags);
	if (m_version > CSE_VERSION_0x39)
		packet.r_sz(m_ini_string);
	if (m_version > CSE_VERSION_0x3d)
		packet.r_u32(m_story_id);
	if (m_version > CSE_VERSION_0x6f)
		packet.r_u32(m_spawn_story_id);
}